

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

result_type
time_plain<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
          (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *r)

{
  result_type rVar1;
  ulong uVar2;
  time_t *in_RSI;
  string res;
  long i;
  long max;
  timer T;
  result_type s;
  double *in_stack_00000128;
  timer *in_stack_ffffffffffffff90;
  string local_50 [32];
  long local_30;
  long local_28;
  timer local_20;
  result_type local_10;
  
  local_10 = 0;
  timer::timer(in_stack_ffffffffffffff90);
  local_28 = 0x1000000;
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    rVar1 = std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::operator()
                      ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                       in_stack_ffffffffffffff90);
    local_10 = rVar1 + local_10;
  }
  timer::time(&local_20,in_RSI);
  to_string<double>(in_stack_00000128);
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (9 < uVar2) break;
    std::__cxx11::string::operator+=(local_50,' ');
  }
  std::operator<<((ostream *)&std::cout,local_50);
  rVar1 = local_10;
  std::__cxx11::string::~string(local_50);
  return rVar1;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}